

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

TRef lj_ir_tostr(jit_State *J,TRef tr)

{
  TRef in_ESI;
  jit_State *in_RDI;
  TraceError in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  if ((in_ESI & 0x1f000000) != 0x4000000) {
    if (5 < (in_ESI >> 0x18 & 0x1f) - 0xe) {
      lj_trace_err((jit_State *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc
                  );
    }
    (in_RDI->fold).ins.field_0.ot = 0x5b04;
    (in_RDI->fold).ins.field_0.op1 = (IRRef1)in_ESI;
    *(ushort *)((long)&(in_RDI->fold).ins + 2) = (ushort)((in_ESI & 0x1f000000) == 0xe000000);
    in_ESI = lj_opt_fold(in_RDI);
  }
  return in_ESI;
}

Assistant:

TRef LJ_FASTCALL lj_ir_tostr(jit_State *J, TRef tr)
{
  if (!tref_isstr(tr)) {
    if (!tref_isnumber(tr))
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    tr = emitir(IRT(IR_TOSTR, IRT_STR), tr,
		tref_isnum(tr) ? IRTOSTR_NUM : IRTOSTR_INT);
  }
  return tr;
}